

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.h
# Opt level: O1

void __thiscall
interfaces::Ipc::addCleanup<interfaces::Echo>(Ipc *this,Echo *iface,function<void_()> cleanup)

{
  code *pcVar1;
  undefined8 *in_RDX;
  long in_FS_OFFSET;
  undefined8 local_38;
  undefined8 uStack_30;
  code *local_28;
  undefined8 local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = 0;
  uStack_30 = 0;
  local_28 = (code *)0x0;
  local_20 = in_RDX[3];
  pcVar1 = (code *)in_RDX[2];
  if (pcVar1 != (code *)0x0) {
    local_38 = *in_RDX;
    uStack_30 = in_RDX[1];
    in_RDX[2] = 0;
    in_RDX[3] = 0;
    local_28 = pcVar1;
  }
  (**(code **)(*(long *)this + 0x28))(this,&Echo::typeinfo,iface,&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void addCleanup(Interface& iface, std::function<void()> cleanup)
    {
        addCleanup(typeid(Interface), &iface, std::move(cleanup));
    }